

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_address.cpp
# Opt level: O2

int __thiscall zmq::udp_address_t::resolve(udp_address_t *this,char *name_,bool bind_,bool ipv6_)

{
  ip_addr_t *ip_addr_;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint16_t port_;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ip_resolver_options_t *piVar9;
  int *piVar10;
  ip_resolver_options_t resolver_opts;
  int local_70;
  string src_name;
  ip_resolver_t resolver;
  
  std::__cxx11::string::assign((char *)&this->_address);
  pcVar8 = strrchr(name_,0x3b);
  if (pcVar8 != (char *)0x0) {
    src_name._M_dataplus._M_p = (pointer)&src_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&src_name,name_,pcVar8);
    ip_resolver_options_t::ip_resolver_options_t(&resolver_opts);
    piVar9 = ip_resolver_options_t::bindable(&resolver_opts,true);
    piVar9 = ip_resolver_options_t::allow_dns(piVar9,false);
    piVar9 = ip_resolver_options_t::allow_nic_name(piVar9,true);
    piVar9 = ip_resolver_options_t::ipv6(piVar9,ipv6_);
    ip_resolver_options_t::expect_port(piVar9,false);
    ip_resolver_t::ip_resolver_t
              (&resolver,
               (ip_resolver_options_t)
               ((uint6)stack0xffffffffffffff8c << 0x20 | (uint6)(uint)resolver_opts._0_4_));
    iVar5 = ip_resolver_t::resolve(&resolver,&this->_bind_address,src_name._M_dataplus._M_p);
    if (iVar5 == 0) {
      bVar4 = ip_addr_t::is_multicast(&this->_bind_address);
      if (bVar4) {
        piVar10 = __errno_location();
        *piVar10 = 0x16;
        goto LAB_0016f83f;
      }
      bVar4 = std::operator==(&src_name,"*");
      uVar6 = 0;
      if (!bVar4) {
        uVar6 = if_nametoindex(src_name._M_dataplus._M_p);
        uVar6 = -(uint)(uVar6 == 0) | uVar6;
      }
      this->_bind_interface = uVar6;
      name_ = pcVar8 + 1;
      bVar4 = true;
    }
    else {
LAB_0016f83f:
      bVar4 = false;
    }
    std::__cxx11::string::~string((string *)&src_name);
    if (!bVar4) {
      return -1;
    }
  }
  ip_resolver_options_t::ip_resolver_options_t(&resolver_opts);
  piVar9 = ip_resolver_options_t::bindable(&resolver_opts,bind_);
  piVar9 = ip_resolver_options_t::allow_dns(piVar9,!bind_);
  piVar9 = ip_resolver_options_t::allow_nic_name(piVar9,bind_);
  piVar9 = ip_resolver_options_t::expect_port(piVar9,true);
  ip_resolver_options_t::ipv6(piVar9,ipv6_);
  ip_resolver_t::ip_resolver_t
            (&resolver,
             (ip_resolver_options_t)
             ((uint6)stack0xffffffffffffff8c << 0x20 | (uint6)(uint)resolver_opts._0_4_));
  ip_addr_ = &this->_target_address;
  iVar5 = ip_resolver_t::resolve(&resolver,ip_addr_,name_);
  if (iVar5 != 0) {
    return -1;
  }
  bVar4 = ip_addr_t::is_multicast(ip_addr_);
  this->_is_multicast = bVar4;
  port_ = ip_addr_t::port(ip_addr_);
  local_70 = 0x16;
  if (pcVar8 == (char *)0x0) {
    if ((!bind_ | this->_is_multicast) == 1) {
      iVar5 = ip_addr_t::family(ip_addr_);
      ip_addr_t::any((ip_addr_t *)&src_name,iVar5);
      *(ulong *)((long)&this->_bind_address + 0xc) =
           CONCAT44(src_name.field_2._M_allocated_capacity._0_4_,src_name._M_string_length._4_4_);
      *(undefined8 *)((long)&this->_bind_address + 0x14) = src_name.field_2._4_8_;
      *(pointer *)&this->_bind_address = src_name._M_dataplus._M_p;
      *(ulong *)((long)&this->_bind_address + 8) =
           CONCAT44(src_name._M_string_length._4_4_,(undefined4)src_name._M_string_length);
      ip_addr_t::set_port((ip_addr_t *)&(this->_bind_address).generic,port_);
      this->_bind_interface = 0;
    }
    else {
      uVar1 = *(undefined8 *)ip_addr_;
      uVar2 = *(undefined8 *)((long)&this->_target_address + 8);
      uVar3 = *(undefined8 *)((long)&this->_target_address + 0x14);
      *(undefined8 *)((long)&this->_bind_address + 0xc) =
           *(undefined8 *)((long)&this->_target_address + 0xc);
      *(undefined8 *)((long)&this->_bind_address + 0x14) = uVar3;
      *(undefined8 *)&this->_bind_address = uVar1;
      *(undefined8 *)((long)&this->_bind_address + 8) = uVar2;
    }
  }
  else {
    if (this->_is_multicast == false) goto LAB_0016f9eb;
    ip_addr_t::set_port((ip_addr_t *)&(this->_bind_address).generic,port_);
  }
  iVar5 = ip_addr_t::family(&this->_bind_address);
  iVar7 = ip_addr_t::family(ip_addr_);
  if (iVar5 == iVar7) {
    if (!ipv6_) {
      return 0;
    }
    if (this->_is_multicast != true) {
      return 0;
    }
    if (-1 < this->_bind_interface) {
      return 0;
    }
    local_70 = 0x13;
  }
LAB_0016f9eb:
  piVar10 = __errno_location();
  *piVar10 = local_70;
  return -1;
}

Assistant:

int zmq::udp_address_t::resolve (const char *name_, bool bind_, bool ipv6_)
{
    //  No IPv6 support yet
    bool has_interface = false;

    _address = name_;

    //  If we have a semicolon then we should have an interface specifier in the
    //  URL
    const char *src_delimiter = strrchr (name_, ';');
    if (src_delimiter) {
        const std::string src_name (name_, src_delimiter - name_);

        ip_resolver_options_t src_resolver_opts;

        src_resolver_opts
          .bindable (true)
          //  Restrict hostname/service to literals to avoid any DNS
          //  lookups or service-name irregularity due to
          //  indeterminate socktype.
          .allow_dns (false)
          .allow_nic_name (true)
          .ipv6 (ipv6_)
          .expect_port (false);

        ip_resolver_t src_resolver (src_resolver_opts);

        const int rc = src_resolver.resolve (&_bind_address, src_name.c_str ());

        if (rc != 0) {
            return -1;
        }

        if (_bind_address.is_multicast ()) {
            //  It doesn't make sense to have a multicast address as a source
            errno = EINVAL;
            return -1;
        }

        //  This is a hack because we need the interface index when binding
        //  multicast IPv6, we can't do it by address. Unfortunately for the
        //  time being we don't have a generic platform-independent function to
        //  resolve an interface index from an address, so we only support it
        //  when an actual interface name is provided.
        if (src_name == "*") {
            _bind_interface = 0;
        } else {
#ifdef HAVE_IF_NAMETOINDEX
            _bind_interface = if_nametoindex (src_name.c_str ());
            if (_bind_interface == 0) {
                //  Error, probably not an interface name.
                _bind_interface = -1;
            }
#endif
        }

        has_interface = true;
        name_ = src_delimiter + 1;
    }

    ip_resolver_options_t resolver_opts;

    resolver_opts.bindable (bind_)
      .allow_dns (!bind_)
      .allow_nic_name (bind_)
      .expect_port (true)
      .ipv6 (ipv6_);

    ip_resolver_t resolver (resolver_opts);

    const int rc = resolver.resolve (&_target_address, name_);
    if (rc != 0) {
        return -1;
    }

    _is_multicast = _target_address.is_multicast ();
    const uint16_t port = _target_address.port ();

    if (has_interface) {
        //  If we have an interface specifier then the target address must be a
        //  multicast address
        if (!_is_multicast) {
            errno = EINVAL;
            return -1;
        }

        _bind_address.set_port (port);
    } else {
        //  If we don't have an explicit interface specifier then the URL is
        //  ambiguous: if the target address is multicast then it's the
        //  destination address and the bind address is ANY, if it's unicast
        //  then it's the bind address when 'bind_' is true and the destination
        //  otherwise
        if (_is_multicast || !bind_) {
            _bind_address = ip_addr_t::any (_target_address.family ());
            _bind_address.set_port (port);
            _bind_interface = 0;
        } else {
            //  If we were asked for a bind socket and the address
            //  provided was not multicast then it was really meant as
            //  a bind address and the target_address is useless.
            _bind_address = _target_address;
        }
    }

    if (_bind_address.family () != _target_address.family ()) {
        errno = EINVAL;
        return -1;
    }

    //  For IPv6 multicast we *must* have an interface index since we can't
    //  bind by address.
    if (ipv6_ && _is_multicast && _bind_interface < 0) {
        errno = ENODEV;
        return -1;
    }

    return 0;
}